

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.h
# Opt level: O0

void __thiscall lf::io::VtkWriter::~VtkWriter(VtkWriter *this)

{
  VtkWriter *this_local;
  
  WriteToFile(&this->vtk_file_,&this->filename_);
  std::array<lf::mesh::utils::CodimMeshDataSet<unsigned_int>,_2UL>::~array(&this->aux_node_offset_);
  std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::~array(&this->aux_nodes_);
  std::__cxx11::string::~string((string *)&this->filename_);
  VtkFile::~VtkFile(&this->vtk_file_);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&this->mesh_);
  return;
}

Assistant:

~VtkWriter() { WriteToFile(vtk_file_, filename_); }